

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t read_bits_16(archive_read *a,rar5 *rar,uint8_t *p,uint16_t *value)

{
  wchar_t bits;
  uint16_t *value_local;
  uint8_t *p_local;
  rar5 *rar_local;
  archive_read *a_local;
  
  if ((long)(rar->bits).in_addr < (rar->cstate).cur_block_size) {
    *value = (uint16_t)
             ((int)((uint)p[(rar->bits).in_addr + L'\x02'] |
                   (uint)p[(rar->bits).in_addr + L'\x01'] << 8 |
                   (uint)p[(rar->bits).in_addr] << 0x10) >> (8U - (rar->bits).bit_addr & 0x1f));
    a_local._4_4_ = L'\0';
  }
  else {
    archive_set_error(&a->archive,0x16,"Premature end of stream during extraction of data (#2)");
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int read_bits_16(struct archive_read* a, struct rar5* rar,
	const uint8_t* p, uint16_t* value)
{
	if(rar->bits.in_addr >= rar->cstate.cur_block_size) {
		archive_set_error(&a->archive,
			ARCHIVE_ERRNO_PROGRAMMER,
			"Premature end of stream during extraction of data (#2)");
		return ARCHIVE_FATAL;
	}

	int bits = (int) ((uint32_t) p[rar->bits.in_addr]) << 16;
	bits |= (int) p[rar->bits.in_addr + 1] << 8;
	bits |= (int) p[rar->bits.in_addr + 2];
	bits >>= (8 - rar->bits.bit_addr);
	*value = bits & 0xffff;
	return ARCHIVE_OK;
}